

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall amrex::EB2::Level::fillLevelSet(Level *this,MultiFab *levelset,Geometry *geom)

{
  int *piVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer ppVar6;
  pointer pIVar7;
  int i;
  Periodicity *period;
  long lVar8;
  pointer ppVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  pointer v;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box bx;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_110;
  Box r_1;
  Array4<double> local_d0;
  MFIter mfi;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&levelset->super_FabArray<amrex::FArrayBox>,-1.0);
  period = Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy
            (&levelset->super_FabArray<amrex::FArrayBox>,
             &(this->m_levelset).super_FabArray<amrex::FArrayBox>,0,0,1,0,0,period,COPY);
  mfi._0_12_ = Geometry::periodicity(geom);
  Periodicity::shiftIntVect
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_110,
             (Periodicity *)&mfi);
  peVar2 = (this->m_covered_grids).m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      *(pointer *)
       ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8)) {
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MFIter::MFIter(&mfi,(FabArrayBase *)levelset,'\0');
    while (mfi.currentIndex < mfi.endIndex) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&levelset->super_FabArray<amrex::FArrayBox>,&mfi);
      MFIter::fabbox(&r,&mfi);
      pIVar7 = local_110._M_impl.super__Vector_impl_data._M_finish;
      bx.bigend.vect[1] = r.bigend.vect[1];
      bx.bigend.vect[2] = r.bigend.vect[2];
      bx.btype.itype = r.btype.itype;
      bx.smallend.vect[0] = r.smallend.vect[0];
      bx.smallend.vect[1] = r.smallend.vect[1];
      bx.smallend.vect[2] = r.smallend.vect[2];
      bx.bigend.vect[0] = r.bigend.vect[0];
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        if ((bx.btype.itype >> ((uint)lVar8 & 0x1f) & 1) != 0) {
          piVar1 = bx.bigend.vect + lVar8;
          *piVar1 = *piVar1 + -1;
        }
      }
      bx._20_8_ = bx._20_8_ & 0xffffffff;
      for (v = local_110._M_impl.super__Vector_impl_data._M_start; v != pIVar7; v = v + 1) {
        r.bigend.vect[1] = bx.bigend.vect[1];
        r.bigend.vect[2] = bx.bigend.vect[2];
        r.btype.itype = bx.btype.itype;
        r.smallend.vect[0] = bx.smallend.vect[0];
        r.smallend.vect[1] = bx.smallend.vect[1];
        r.smallend.vect[2] = bx.smallend.vect[2];
        r.bigend.vect[0] = bx.bigend.vect[0];
        Box::operator+=(&r,v);
        BoxArray::intersections(&this->m_covered_grids,&r,&isects);
        ppVar6 = isects.
                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar9 = isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar6;
            ppVar9 = ppVar9 + 1) {
          r_1.smallend.vect._0_8_ = *(undefined8 *)(ppVar9->second).smallend.vect;
          uVar3 = *(undefined8 *)((ppVar9->second).smallend.vect + 2);
          r_1._20_8_ = *(undefined8 *)((ppVar9->second).bigend.vect + 2);
          r_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(ppVar9->second).bigend.vect >> 0x20);
          r_1.smallend.vect[2] = (int)uVar3;
          r_1.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
          Box::operator-=(&r_1,v);
          auVar5 = _DAT_006f8e90;
          auVar4 = _DAT_006f8e80;
          r.smallend.vect[0] = r_1.smallend.vect[0];
          r.smallend.vect[1] = r_1.smallend.vect[1];
          uVar3 = r.smallend.vect._0_8_;
          r.smallend.vect[2] = r_1.smallend.vect[2];
          r.bigend.vect[0] = r_1.bigend.vect[0];
          r.bigend.vect[1] = r_1.bigend.vect[1];
          r.bigend.vect[2] = r_1.bigend.vect[2];
          r.btype.itype = r_1.btype.itype;
          for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
            if ((r.btype.itype >> ((uint)lVar8 & 0x1f) & 1) == 0) {
              piVar1 = r.bigend.vect + lVar8;
              *piVar1 = *piVar1 + 1;
            }
          }
          r.smallend.vect[0] = r_1.smallend.vect[0];
          r.smallend.vect[1] = r_1.smallend.vect[1];
          uVar10 = r.bigend.vect[0] - r.smallend.vect[0];
          auVar14._4_4_ = 0;
          auVar14._0_4_ = uVar10;
          auVar14._8_4_ = uVar10;
          auVar14._12_4_ = 0;
          auVar14 = auVar14 ^ _DAT_006f8e90;
          for (lVar8 = (long)r_1.smallend.vect[2]; (int)lVar8 <= r.bigend.vect[2]; lVar8 = lVar8 + 1
              ) {
            lVar13 = (long)local_d0.p +
                     (lVar8 - local_d0.begin.z) * local_d0.kstride * 8 +
                     ((long)r.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                     (long)local_d0.begin.x * -8 + (long)r.smallend.vect[0] * 8 + 8;
            for (lVar11 = (long)r.smallend.vect[1]; lVar11 <= r.bigend.vect[1]; lVar11 = lVar11 + 1)
            {
              if (r.smallend.vect[0] <= r.bigend.vect[0]) {
                uVar12 = 0;
                do {
                  auVar15._8_4_ = (int)uVar12;
                  auVar15._0_8_ = uVar12;
                  auVar15._12_4_ = (int)(uVar12 >> 0x20);
                  auVar15 = (auVar15 | auVar4) ^ auVar5;
                  if ((bool)(~(auVar14._4_4_ < auVar15._4_4_ ||
                              auVar14._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar14._4_4_) & 1))
                  {
                    *(undefined8 *)(lVar13 + -8 + uVar12 * 8) = 0x3ff0000000000000;
                  }
                  if (auVar15._12_4_ <= auVar14._12_4_ &&
                      (auVar15._8_4_ <= auVar14._8_4_ || auVar15._12_4_ != auVar14._12_4_)) {
                    *(undefined8 *)(lVar13 + uVar12 * 8) = 0x3ff0000000000000;
                  }
                  uVar12 = uVar12 + 2;
                } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar12);
              }
              lVar13 = lVar13 + local_d0.jstride * 8;
            }
          }
          r.smallend.vect._0_8_ = uVar3;
        }
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
    ~_Vector_base(&isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 );
  }
  std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base(&local_110);
  return;
}

Assistant:

void
Level::fillLevelSet (MultiFab& levelset, const Geometry& geom) const
{
    levelset.setVal(-1.0);
    levelset.ParallelCopy(m_levelset,0,0,1,0,0);

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

    Real cov_val = 1.0; // for covered cells

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(levelset); mfi.isValid(); ++mfi)
        {
            const auto& lsfab = levelset.array(mfi);
            const Box& ccbx = amrex::enclosedCells(mfi.fabbox());
            for (const auto& iv : pshifts)
            {
                m_covered_grids.intersections(ccbx+iv, isects);
                for (const auto& is : isects) {
                    const Box& fbx = amrex::surroundingNodes(is.second-iv);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(fbx, i, j, k,
                    {
                        lsfab(i,j,k) = cov_val;
                    });
                }
            }
        }
    }
}